

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

float * Tim_ManGetArrTimes(Tim_Man_t *p)

{
  int iVar1;
  bool bVar2;
  int local_2c;
  Tim_Obj_t *pTStack_28;
  int i;
  Tim_Obj_t *pObj;
  float *pTimes;
  Tim_Man_t *p_local;
  
  local_2c = 0;
  while( true ) {
    bVar2 = false;
    if (local_2c < p->nCis) {
      pTStack_28 = p->pCis + local_2c;
      bVar2 = pTStack_28 != (Tim_Obj_t *)0x0;
    }
    if ((!bVar2) ||
       ((pTStack_28->iObj2Box < 0 && ((pTStack_28->timeArr != 0.0 || (NAN(pTStack_28->timeArr)))))))
    break;
    local_2c = local_2c + 1;
  }
  iVar1 = Tim_ManPiNum(p);
  if (local_2c == iVar1) {
    p_local = (Tim_Man_t *)0x0;
  }
  else {
    iVar1 = Tim_ManCiNum(p);
    p_local = (Tim_Man_t *)malloc((long)iVar1 << 2);
    iVar1 = Tim_ManCiNum(p);
    memset(p_local,0xff,(long)iVar1 << 2);
    local_2c = 0;
    while( true ) {
      bVar2 = false;
      if (local_2c < p->nCis) {
        pTStack_28 = p->pCis + local_2c;
        bVar2 = pTStack_28 != (Tim_Obj_t *)0x0;
      }
      if (!bVar2) break;
      if (pTStack_28->iObj2Box < 0) {
        *(float *)((long)&p_local->vBoxes + (long)local_2c * 4) = pTStack_28->timeArr;
      }
      local_2c = local_2c + 1;
    }
  }
  return (float *)p_local;
}

Assistant:

float * Tim_ManGetArrTimes( Tim_Man_t * p )
{
    float * pTimes;
    Tim_Obj_t * pObj;
    int i;
    Tim_ManForEachPi( p, pObj, i )
        if ( pObj->timeArr != 0.0 )
            break;
    if ( i == Tim_ManPiNum(p) )
        return NULL;
    pTimes  = ABC_FALLOC( float, Tim_ManCiNum(p) );
    Tim_ManForEachPi( p, pObj, i )
        pTimes[i] = pObj->timeArr;
    return pTimes;
}